

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O3

void __thiscall
WordSplitSVTest_two_words_Test<signed_char>::TestBody
          (WordSplitSVTest_two_words_Test<signed_char> *this)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  split_result;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> word;
  int local_68 [2];
  long *local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_48;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_28;
  
  make_word<signed_char,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
            (&local_28,8,'\0');
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::push_back
            (&local_28,'\0');
  make_word<signed_char,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
            (&local_48,8,'\0');
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::_M_append
            (&local_28,local_48._M_dataplus._M_p,local_48._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  jessilib::word_split<std::vector,_const_signed_char_*,_const_signed_char_*,_signed_char>
            ((container_type_conflict1 *)&local_48,local_28._M_dataplus._M_p,
             local_28._M_dataplus._M_p + local_28._M_string_length,'\0');
  local_60 = (long *)((long)(local_48._M_string_length - (long)local_48._M_dataplus._M_p) >> 5);
  local_68[0] = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_58,"split_result.size()","2",(unsigned_long *)&local_60,local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x6e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  local_60 = *(long **)(local_48._M_dataplus._M_p + 8);
  local_68[0] = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_58,"split_result[0].size()","8",(unsigned_long *)&local_60,local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x6f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  local_60 = *(long **)(local_48._M_dataplus._M_p + 0x28);
  local_68[0] = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_58,"split_result[1].size()","8",(unsigned_long *)&local_60,local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x70,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_60 != (long *)0x0) {
      (**(code **)(*local_60 + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  std::
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
             *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, two_words) {
	auto word = make_word<TypeParam>();
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>();
	std::basic_string_view<TypeParam> words = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(words, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 2);
	EXPECT_EQ(split_result[0].size(), 8);
	EXPECT_EQ(split_result[1].size(), 8);
}